

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O0

void printobj(global_State *g,GCObject *o)

{
  uint local_30;
  uint local_2c;
  GCObject *o_local;
  global_State *g_local;
  
  if ((o->marked & (g->currentwhite ^ 0x18)) == 0) {
    if ((o->marked & 0x20) == 0) {
      local_30 = 0x67;
      if ((o->marked & 0x18) != 0) {
        local_30 = 0x77;
      }
    }
    else {
      local_30 = 0x62;
    }
    local_2c = local_30;
  }
  else {
    local_2c = 100;
  }
  printf("||%s(%p)-%c%c(%02X)||",luaT_typenames_[(int)((o->tt & 0xf) + 1)],o,(ulong)local_2c,
         (ulong)(uint)(int)"ns01oTt"[(int)(o->marked & 7)],(ulong)o->marked);
  if ((o->tt == '\x04') || (o->tt == '\x14')) {
    if ((o->tt & 0xf) != 4) {
      __assert_fail("(((o)->tt) & 0x0F) == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                    ,0xe5,"void printobj(global_State *, GCObject *)");
    }
    printf(" \'%s\'",&o[1].tt);
  }
  return;
}

Assistant:

static void printobj (global_State *g, GCObject *o) {
  printf("||%s(%p)-%c%c(%02X)||",
           ttypename(novariant(o->tt)), (void *)o,
           isdead(g,o) ? 'd' : isblack(o) ? 'b' : iswhite(o) ? 'w' : 'g',
           "ns01oTt"[getage(o)], o->marked);
  if (o->tt == LUA_TSHRSTR || o->tt == LUA_TLNGSTR)
    printf(" '%s'", getstr(gco2ts(o)));
}